

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name)

{
  bool bVar1;
  Tables *pTVar2;
  ulong uVar4;
  Mutex *mu;
  Symbol SVar5;
  MutexLockMaybe lock;
  MutexLockMaybe MStack_38;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar3;
  
  if (this->pool_ == pool) {
    mu = (Mutex *)0x0;
  }
  else {
    mu = pool->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&MStack_38,mu);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&pool->tables_);
  SVar5 = DescriptorPool::Tables::FindSymbol(pTVar2,name);
  aVar3 = SVar5.field_1;
  if (SVar5.type == NULL_SYMBOL) {
    if (pool->underlay_ != (DescriptorPool *)0x0) {
      SVar5 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,name);
      aVar3 = SVar5.field_1;
      uVar4 = (ulong)SVar5.type;
      if (SVar5.type != NULL_SYMBOL) goto LAB_001e9488;
    }
    bVar1 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name);
    uVar4 = 0;
    if (bVar1) {
      pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&pool->tables_);
      SVar5 = DescriptorPool::Tables::FindSymbol(pTVar2,name);
      aVar3 = SVar5.field_1;
      uVar4 = (ulong)SVar5.type;
    }
  }
  else {
    uVar4 = (ulong)SVar5.type;
  }
LAB_001e9488:
  internal::MutexLockMaybe::~MutexLockMaybe(&MStack_38);
  SVar5.field_1.descriptor = aVar3.descriptor;
  SVar5._0_8_ = uVar4;
  return SVar5;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // In theory, we shouldn't need to check fallback_database_ because the
    // symbol should be in one of its file's direct dependencies, and we have
    // already loaded those by the time we get here.  But we check anyway so
    // that we can generate better error message when dependencies are missing
    // (i.e., "missing dependency" rather than "type is not defined").
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}